

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetWriter::PrepareRowGroup
          (ParquetWriter *this,ColumnDataCollection *buffer,PreparedRowGroup *result)

{
  _RowGroup__isset *p_Var1;
  ColumnWriter *pCVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  reference pvVar8;
  reference this_00;
  type __args;
  reference pvVar9;
  DataChunk *pDVar10;
  reference pvVar11;
  type pCVar12;
  reference pvVar13;
  pointer pCVar14;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *write_state_1;
  ulong uVar15;
  pointer __args_00;
  ulong uVar16;
  idx_t i_1;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *write_state;
  ulong uVar17;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *this_01;
  idx_t i;
  size_type sVar18;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  write_states;
  long local_238;
  vector<unsigned_long,_true> column_ids;
  ColumnDataChunkIterationHelper local_210;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
  *local_1f0;
  PreparedRowGroup *local_1e8;
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
  *local_1e0;
  vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> col_writers;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1b8;
  ColumnDataChunkIterator __begin2;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  ColumnDataChunkIterator __end2;
  
  lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(buffer->count);
  (result->row_group).num_rows = lVar6;
  p_Var1 = &(result->row_group).__isset;
  *p_Var1 = (_RowGroup__isset)((byte)*p_Var1 | 2);
  local_1f0 = (vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
               *)&result->states;
  local_1e0 = &this->column_writers;
  local_238 = 0;
  uVar16 = 0;
  local_1e8 = result;
  while( true ) {
    uVar7 = ((long)(buffer->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(buffer->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar7 <= uVar16) break;
    column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    col_writers.
    super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    write_states.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    col_writers.
    super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col_writers.
    super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    write_states.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    write_states.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar7 = uVar7 + local_238;
    uVar15 = 8;
    if (uVar7 < 8) {
      uVar15 = uVar7;
    }
    uVar17 = 0;
    while( true ) {
      if (uVar15 == uVar17) break;
      __begin2.collection = (ColumnDataCollection *)(uVar16 + uVar17);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 (unsigned_long *)&__begin2);
      pvVar8 = vector<unsigned_long,_true>::back
                         ((vector<unsigned_long,_true> *)
                          &column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      this_00 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                ::get<true>(local_1e0,*pvVar8);
      __args = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
               operator*(this_00);
      ::std::
      vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
      ::emplace_back<duckdb::ColumnWriter&>
                ((vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
                  *)&col_writers,__args);
      pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::back(&col_writers);
      (*pvVar9->_M_data->_vptr_ColumnWriter[2])(&__begin2,pvVar9->_M_data,local_1e8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
                  *)&write_states,
                 (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  *)&__begin2);
      if (__begin2.collection != (ColumnDataCollection *)0x0) {
        (*(code *)(((__begin2.collection)->allocator).internal.
                   super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->alloc)();
      }
      uVar17 = uVar17 + 1;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,
               &column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    ColumnDataCollection::Chunks(&local_210,buffer,(vector<unsigned_long,_true> *)&local_1b8);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1b8);
    ColumnDataChunkIterationHelper::begin(&__begin2,&local_210);
    ColumnDataChunkIterationHelper::end(&__end2,&local_210);
    uVar15 = 8;
    if (uVar7 < 8) {
      uVar15 = uVar7;
    }
    while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (&__begin2,&__end2), bVar4) {
      pDVar10 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin2);
      for (sVar18 = 0; uVar15 != sVar18; sVar18 = sVar18 + 1) {
        pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                           (&col_writers,sVar18);
        iVar5 = (*pvVar9->_M_data->_vptr_ColumnWriter[3])();
        if ((char)iVar5 != '\0') {
          pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                             (&col_writers,sVar18);
          pCVar2 = pvVar9->_M_data;
          pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                    ::get<true>(&write_states,sVar18);
          pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                    ::operator*(pvVar11);
          pvVar13 = vector<duckdb::Vector,_true>::get<true>(&pDVar10->data,sVar18);
          (*pCVar2->_vptr_ColumnWriter[4])(pCVar2,pCVar12,0,pvVar13,pDVar10->count);
        }
      }
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin2);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin2);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_210.column_ids)
    ;
    uVar15 = 8;
    if (uVar7 < 8) {
      uVar15 = uVar7;
    }
    for (sVar18 = 0;
        puVar3 = write_states.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        this_01 = write_states.
                  super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar15 != sVar18; sVar18 = sVar18 + 1)
    {
      pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                         (&col_writers,sVar18);
      iVar5 = (*pvVar9->_M_data->_vptr_ColumnWriter[3])();
      if ((char)iVar5 != '\0') {
        pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                           (&col_writers,sVar18);
        pCVar2 = pvVar9->_M_data;
        pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                  ::get<true>(&write_states,sVar18);
        pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator*(pvVar11);
        (*pCVar2->_vptr_ColumnWriter[5])(pCVar2,pCVar12);
      }
    }
    for (; this_01 != puVar3; this_01 = this_01 + 1) {
      pCVar14 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                ::operator->(this_01);
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (&(pCVar14->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,buffer->count);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
               &column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    ColumnDataCollection::Chunks(&local_210,buffer,(vector<unsigned_long,_true> *)&local_e8);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
    ColumnDataChunkIterationHelper::begin(&__begin2,&local_210);
    ColumnDataChunkIterationHelper::end(&__end2,&local_210);
    uVar15 = 8;
    if (uVar7 < 8) {
      uVar15 = uVar7;
    }
    while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (&__begin2,&__end2), bVar4) {
      pDVar10 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin2);
      for (sVar18 = 0; uVar15 != sVar18; sVar18 = sVar18 + 1) {
        pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                           (&col_writers,sVar18);
        pCVar2 = pvVar9->_M_data;
        pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                  ::get<true>(&write_states,sVar18);
        pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator*(pvVar11);
        pvVar13 = vector<duckdb::Vector,_true>::get<true>(&pDVar10->data,sVar18);
        (*pCVar2->_vptr_ColumnWriter[6])(pCVar2,pCVar12,0,pvVar13,pDVar10->count);
      }
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin2);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin2);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_210.column_ids)
    ;
    uVar15 = 8;
    if (uVar7 < 8) {
      uVar15 = uVar7;
    }
    for (sVar18 = 0; uVar15 != sVar18; sVar18 = sVar18 + 1) {
      pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                         (&col_writers,sVar18);
      pCVar2 = pvVar9->_M_data;
      pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                ::get<true>(&write_states,sVar18);
      pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                ::operator*(pvVar11);
      (*pCVar2->_vptr_ColumnWriter[7])(pCVar2,pCVar12);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_100,
               &column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    ColumnDataCollection::Chunks(&local_210,buffer,(vector<unsigned_long,_true> *)&local_100);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_100);
    ColumnDataChunkIterationHelper::begin(&__begin2,&local_210);
    ColumnDataChunkIterationHelper::end(&__end2,&local_210);
    if (7 < uVar7) {
      uVar7 = 8;
    }
    while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (&__begin2,&__end2), bVar4) {
      pDVar10 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin2);
      for (sVar18 = 0; uVar7 != sVar18; sVar18 = sVar18 + 1) {
        pvVar9 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::get<true>
                           (&col_writers,sVar18);
        pCVar2 = pvVar9->_M_data;
        pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                  ::get<true>(&write_states,sVar18);
        pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator*(pvVar11);
        pvVar13 = vector<duckdb::Vector,_true>::get<true>(&pDVar10->data,sVar18);
        (*pCVar2->_vptr_ColumnWriter[8])(pCVar2,pCVar12,pvVar13,pDVar10->count);
      }
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin2);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin2);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_210.column_ids)
    ;
    puVar3 = write_states.
             super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args_00 = write_states.
                     super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; __args_00 != puVar3;
        __args_00 = __args_00 + 1) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                (local_1f0,__args_00);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ::~vector(&write_states.
               super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
             );
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                     *)&col_writers);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
    uVar16 = uVar16 + 8;
    local_238 = local_238 + -8;
  }
  return;
}

Assistant:

void ParquetWriter::PrepareRowGroup(ColumnDataCollection &buffer, PreparedRowGroup &result) {
	// We write 8 columns at a time so that iterating over ColumnDataCollection is more efficient
	static constexpr idx_t COLUMNS_PER_PASS = 8;

	// We want these to be buffer-managed
	D_ASSERT(buffer.GetAllocatorType() == ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR);

	// set up a new row group for this chunk collection
	auto &row_group = result.row_group;
	row_group.num_rows = NumericCast<int64_t>(buffer.Count());
	row_group.__isset.file_offset = true;

	auto &states = result.states;
	// iterate over each of the columns of the chunk collection and write them
	D_ASSERT(buffer.ColumnCount() == column_writers.size());
	for (idx_t col_idx = 0; col_idx < buffer.ColumnCount(); col_idx += COLUMNS_PER_PASS) {
		const auto next = MinValue<idx_t>(buffer.ColumnCount() - col_idx, COLUMNS_PER_PASS);
		vector<column_t> column_ids;
		vector<reference<ColumnWriter>> col_writers;
		vector<unique_ptr<ColumnWriterState>> write_states;
		for (idx_t i = 0; i < next; i++) {
			column_ids.emplace_back(col_idx + i);
			col_writers.emplace_back(*column_writers[column_ids.back()]);
			write_states.emplace_back(col_writers.back().get().InitializeWriteState(row_group));
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				if (col_writers[i].get().HasAnalyze()) {
					col_writers[i].get().Analyze(*write_states[i], nullptr, chunk.data[i], chunk.size());
				}
			}
		}

		for (idx_t i = 0; i < next; i++) {
			if (col_writers[i].get().HasAnalyze()) {
				col_writers[i].get().FinalizeAnalyze(*write_states[i]);
			}
		}

		// Reserving these once at the start really pays off
		for (auto &write_state : write_states) {
			write_state->definition_levels.reserve(buffer.Count());
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Prepare(*write_states[i], nullptr, chunk.data[i], chunk.size());
			}
		}

		for (idx_t i = 0; i < next; i++) {
			col_writers[i].get().BeginWrite(*write_states[i]);
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Write(*write_states[i], chunk.data[i], chunk.size());
			}
		}

		for (auto &write_state : write_states) {
			states.push_back(std::move(write_state));
		}
	}
}